

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

const_iterator __thiscall
Vector::load(Vector *this,void *container_ptr,size_t element_count,InputStream *stream,
            const_iterator begin,const_iterator end)

{
  bool bVar1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *this_00;
  reference puVar2;
  reference pvVar3;
  tuples local_a8 [16];
  unsigned_long *local_98;
  unsigned_long *local_90;
  cons<unsigned_long,_boost::tuples::cons<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_boost::tuples::null_type>_>
  local_88 [16];
  ulong local_78;
  size_t i;
  size_t out_offset;
  size_t size;
  const_iterator it;
  size_t element_size;
  Type *element_t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_ptr;
  InputStream *stream_local;
  size_t element_count_local;
  void *container_ptr_local;
  Vector *this_local;
  const_iterator end_local;
  const_iterator begin_local;
  const_iterator it_end;
  
  end_local = begin;
  Typelib::Indirect::getIndirection();
  it._M_current = (unsigned_long *)Typelib::Type::getSize();
  resize(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)container_ptr,element_count);
  size = (size_t)end_local._M_current;
  bVar1 = isElementMemcpy(this);
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&size);
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(this_00);
    out_offset = *puVar2 * element_count;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)container_ptr,0);
    (**(code **)(*(long *)stream + 0x10))(stream,pvVar3,out_offset);
    begin_local._M_current =
         (unsigned_long *)
         __gnu_cxx::
         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator+(&end_local,2);
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::__normal_iterator(&begin_local);
    i = 0;
    for (local_78 = 0; local_78 < element_count; local_78 = local_78 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)container_ptr,
                          local_78 * (long)it._M_current);
      local_90 = end_local._M_current;
      local_98 = end._M_current;
      Typelib::ValueOps::load(local_88,pvVar3,0,stream,end_local._M_current,end._M_current);
      boost::tuples::
      tie<unsigned_long,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (local_a8,&i,&begin_local);
      boost::tuples::
      tuple<unsigned_long&,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
      ::operator=((tuple<unsigned_long&,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
                   *)local_a8,local_88);
    }
  }
  return (const_iterator)begin_local._M_current;
}

Assistant:

Container::MarshalOps::const_iterator Vector::load(
        void* container_ptr, size_t element_count,
        InputStream& stream,
        MarshalOps::const_iterator const begin, MarshalOps::const_iterator const end) const
{
    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(container_ptr);

    Type const& element_t = getIndirection();
    size_t      element_size = element_t.getSize();
    resize(vector_ptr, element_count);

    MarshalOps::const_iterator it = begin;
    if (isElementMemcpy())
    {
        size_t size       = *(++it) * element_count;
        stream.read(&(*vector_ptr)[0], size);
        return begin + 2;
    }
    else
    {
        MarshalOps::const_iterator it_end;
        size_t out_offset = 0;
        for (size_t i = 0; i < element_count; ++i)
        {
            boost::tie(out_offset, it_end) =
                ValueOps::load(&(*vector_ptr)[i * element_size], 0,
                    stream, begin, end);
        }
        return it_end;
    }
}